

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cpp
# Opt level: O2

_Fact * __thiscall r_exec::_Fact::get_absentee(_Fact *this)

{
  bool bVar1;
  int iVar2;
  _Fact *p_Var3;
  undefined4 extraout_var;
  uint64_t uVar4;
  uint64_t uVar5;
  undefined4 extraout_var_00;
  size_t in_RSI;
  
  p_Var3 = this;
  bVar1 = is_fact(this);
  if (bVar1) {
    p_Var3 = (_Fact *)AntiFact::operator_new((AntiFact *)p_Var3,in_RSI);
    iVar2 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[9])(this,0);
    uVar4 = get_after(this);
    uVar5 = get_before(this);
    AntiFact::AntiFact((AntiFact *)p_Var3,(Code *)CONCAT44(extraout_var,iVar2),uVar4,uVar5,1.0,1.0);
  }
  else {
    p_Var3 = (_Fact *)Fact::operator_new((Fact *)p_Var3,in_RSI);
    iVar2 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[9])(this,0);
    uVar4 = get_after(this);
    uVar5 = get_before(this);
    Fact::Fact((Fact *)p_Var3,(Code *)CONCAT44(extraout_var_00,iVar2),uVar4,uVar5,1.0,1.0);
  }
  return p_Var3;
}

Assistant:

_Fact *_Fact::get_absentee() const
{
    _Fact *absentee;

    if (is_fact()) {
        absentee = new AntiFact(get_reference(0), get_after(), get_before(), 1, 1);
    } else {
        absentee = new Fact(get_reference(0), get_after(), get_before(), 1, 1);
    }

    return absentee;
}